

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::force_tracker_request
          (torrent *this,time_point t,int tracker_idx,reannounce_flags_t flags)

{
  session_interface *psVar1;
  bool bVar2;
  bool bVar3;
  time_point32 now;
  reference paVar4;
  size_t sVar5;
  announce_entry *e_00;
  announce_entry *e_1;
  undefined1 local_b0 [8];
  announce_entry e;
  iterator __end3;
  iterator __begin3;
  tracker_list *__range3;
  bool found_one;
  int tracker_idx_local;
  torrent *this_local;
  reannounce_flags_t flags_local;
  time_point t_local;
  
  bVar2 = is_paused(this);
  if (!bVar2) {
    bVar2 = false;
    if (tracker_idx == -1) {
      tracker_list::begin((tracker_list *)&__end3);
      tracker_list::end((tracker_list *)&e.listen_socket_version);
      while (bVar3 = boost::intrusive::operator!=
                               (&__end3,(list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_false>
                                         *)&e.listen_socket_version), bVar3) {
        paVar4 = boost::intrusive::
                 list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_false>
                 ::operator*(&__end3);
        announce_entry::announce_entry((announce_entry *)local_b0,paVar4);
        psVar1 = (this->super_torrent_hot_members).m_ses;
        bVar3 = is_ssl_torrent(this);
        anon_unknown_135::refresh_endpoint_list
                  (psVar1,bVar3,(bool)((byte)this->field_0x606 >> 6 & 1),(announce_entry *)local_b0)
        ;
        psVar1 = (this->super_torrent_hot_members).m_ses;
        bVar3 = is_ssl_torrent(this);
        bVar3 = anon_unknown_135::trigger_announce
                          (psVar1,bVar3,(bool)((byte)this->field_0x606 >> 6 & 1),flags,t,
                           (announce_entry *)local_b0);
        bVar2 = bVar2 != false || bVar3;
        announce_entry::~announce_entry((announce_entry *)local_b0);
        boost::intrusive::
        list_iterator<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_false>
        ::operator++(&__end3);
      }
    }
    else {
      if (tracker_idx < 0) {
        return;
      }
      sVar5 = tracker_list::size(&this->m_trackers);
      if ((int)sVar5 <= tracker_idx) {
        return;
      }
      e_00 = tracker_list::find(&this->m_trackers,tracker_idx);
      if (e_00 == (announce_entry *)0x0) {
        return;
      }
      psVar1 = (this->super_torrent_hot_members).m_ses;
      bVar2 = is_ssl_torrent(this);
      bVar2 = anon_unknown_135::trigger_announce
                        (psVar1,bVar2,(bool)((byte)this->field_0x606 >> 6 & 1),flags,t,e_00);
    }
    if (bVar2 == false) {
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"*** found no tracker endpoints to announce");
    }
    now = time_now32();
    update_tracker_timer(this,now);
  }
  return;
}

Assistant:

void torrent::force_tracker_request(time_point const t, int const tracker_idx
		, reannounce_flags_t const flags)
	{
		TORRENT_ASSERT_PRECOND((tracker_idx >= 0
			&& tracker_idx < int(m_trackers.size()))
			|| tracker_idx == -1);

		if (is_paused()) return;
		bool found_one = false;
		if (tracker_idx == -1)
		{
			for (auto e : m_trackers)
			{
				// make sure we check for new endpoints from the listen sockets
				refresh_endpoint_list(m_ses, is_ssl_torrent(), bool(m_complete_sent), e);
				found_one |= trigger_announce(m_ses, is_ssl_torrent(), bool(m_complete_sent), flags, t, e);
			}
		}
		else
		{
			if (tracker_idx < 0 || tracker_idx >= int(m_trackers.size()))
				return;
			auto* e = m_trackers.find(tracker_idx);
			if (e == nullptr) return;
			found_one |= trigger_announce(m_ses, is_ssl_torrent(), bool(m_complete_sent), flags, t, *e);
		}

#ifndef TORRENT_DISABLE_LOGGING
		if (!found_one)
		{
			debug_log("*** found no tracker endpoints to announce");
		}
#endif
		update_tracker_timer(aux::time_now32());
	}